

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QGraphicsObject_*>::reallocateAndGrow
          (QArrayDataPointer<QGraphicsObject_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QGraphicsObject_*> *old)

{
  QArrayData *pQVar1;
  QGraphicsObject **ppQVar2;
  qsizetype qVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QArrayDataPointer<QGraphicsObject_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QGraphicsObject_*> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar5 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,8,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3),
                        Grow);
    this->d = (Data *)auVar5._0_8_;
    this->ptr = (QGraphicsObject **)auVar5._8_8_;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QGraphicsObject **)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if ((this->size != 0) && (lVar4 = this->size + (n >> 0x3f & n), lVar4 != 0)) {
      memcpy(local_48.ptr + local_48.size,this->ptr,lVar4 * 8);
      local_48.size = local_48.size + lVar4;
    }
    pQVar1 = &this->d->super_QArrayData;
    ppQVar2 = this->ptr;
    *(undefined4 *)&this->d = local_48.d._0_4_;
    *(undefined4 *)((long)&this->d + 4) = local_48.d._4_4_;
    *(undefined4 *)&this->ptr = local_48.ptr._0_4_;
    *(undefined4 *)((long)&this->ptr + 4) = local_48.ptr._4_4_;
    qVar3 = this->size;
    this->size = local_48.size;
    local_48.d = (Data *)pQVar1;
    local_48.ptr = ppQVar2;
    local_48.size = qVar3;
    if (old != (QArrayDataPointer<QGraphicsObject_*> *)0x0) {
      local_48.d = old->d;
      old->d = (Data *)pQVar1;
      local_48.ptr = old->ptr;
      old->ptr = ppQVar2;
      local_48.size = old->size;
      old->size = qVar3;
    }
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }